

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

bool __thiscall FirewirePort::WriteBroadcastOutput(FirewirePort *this,quadlet_t *buffer,uint size)

{
  int iVar1;
  
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[6])(this,0,0xffffffff0000,buffer,(ulong)size,0);
  return SUB41(iVar1,0);
}

Assistant:

bool FirewirePort::WriteBroadcastOutput(quadlet_t *buffer, unsigned int size)
{
#if 1
    return WriteBlockNode(0, 0xffffffff0000, buffer, size);
#else
    return WriteBlockNode(FW_NODE_BROADCAST, 0xffffff000000,  // now the address is hardcoded
                          buffer, size);
#endif
}